

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

size_t __thiscall google::protobuf::internal::RealDebugCounter::value(RealDebugCounter *this)

{
  RealDebugCounter *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(size_t *)this;
}

Assistant:

size_t value() const { return counter_.load(std::memory_order_relaxed); }